

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.cpp
# Opt level: O0

spv_result_t
spvTextEncodeOperand
          (AssemblyGrammar *grammar,AssemblyContext *context,spv_operand_type_t type,char *textValue
          ,spv_instruction_t *pInst,spv_operand_pattern_t *pExpectedOperands)

{
  Op OVar1;
  spv_instruction_t *name;
  spv_operand_type_t type_00;
  AssemblyContext *pAVar2;
  AssemblyContext *this;
  bool bVar3;
  spv_result_t sVar4;
  size_type sVar5;
  char *pcVar6;
  reference pvVar7;
  size_t name_len;
  DiagnosticStream *pDVar8;
  char *local_1f48;
  DiagnosticStream local_1f40;
  char *local_1d68;
  DiagnosticStream local_1d60;
  spv_operand_desc local_1b88;
  spv_operand_desc entry;
  DiagnosticStream local_1b78;
  spv_result_t local_19a0;
  spv_result_t local_199c;
  spv_result_t error_8;
  spv_result_t error_7;
  DiagnosticStream local_1990;
  spv_result_t local_17b8;
  uint32_t local_17b4;
  spv_result_t error_6;
  uint32_t value;
  spv_ext_inst_type_t local_15d4;
  undefined1 local_15d0 [4];
  spv_ext_inst_type_t ext_inst_type_1;
  DiagnosticStream local_13f8;
  Op local_121c;
  undefined1 local_1218 [4];
  spv_result_t error_5;
  spv_literal_t literal;
  undefined1 local_11e0 [4];
  spv_result_t error_4;
  IdType local_1008;
  spv_opcode_desc local_ff4;
  IdTypeClass local_fec;
  DiagnosticStream local_fe8;
  char *local_e10;
  char *opcode_name;
  spv_opcode_desc d;
  IdTypeClass local_df8;
  spv_opcode_desc local_dec;
  IdTypeClass local_de4;
  spv_opcode_desc local_de0;
  IdType expected_type_2;
  spv_result_t error_3;
  spv_result_t error_2;
  IdType expected_type_1;
  spv_result_t error_1;
  IdType expected_type;
  spv_opcode_desc local_bd8;
  spv_opcode_desc opcodeEntry;
  DiagnosticStream local_bc8;
  Op local_9ec;
  value_type local_9e8;
  Op opcode;
  DiagnosticStream local_9e0;
  undefined1 local_808 [8];
  spv_literal_t extInstValue;
  spv_ext_inst_desc local_600;
  spv_ext_inst_desc extInst;
  spv_ext_inst_type_t local_420;
  uint32_t local_41c;
  spv_ext_inst_type_t ext_inst_type;
  uint32_t id;
  DiagnosticStream local_240;
  spv_result_t local_64;
  undefined1 local_60 [4];
  spv_result_t error_code_for_literals;
  spv_result_t local_44;
  spv_operand_pattern_t *psStack_40;
  spv_result_t error;
  spv_operand_pattern_t *pExpectedOperands_local;
  spv_instruction_t *pInst_local;
  char *textValue_local;
  AssemblyContext *pAStack_20;
  spv_operand_type_t type_local;
  AssemblyContext *context_local;
  AssemblyGrammar *grammar_local;
  
  psStack_40 = pExpectedOperands;
  pExpectedOperands_local = (spv_operand_pattern_t *)pInst;
  pInst_local = (spv_instruction_t *)textValue;
  textValue_local._4_4_ = type;
  pAStack_20 = context;
  context_local = (AssemblyContext *)grammar;
  if (*textValue == '!') {
    local_44 = anon_unknown.dwarf_222cc27::encodeImmediate(context,textValue,pInst);
    if (local_44 == SPV_SUCCESS) {
      spvAlternatePatternFollowingImmediate((spv_operand_pattern_t *)local_60,psStack_40);
      std::vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>::operator=
                (psStack_40,
                 (vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_> *)local_60);
      std::vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>::~vector
                ((vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_> *)local_60);
      return SPV_SUCCESS;
    }
    return local_44;
  }
  bVar3 = spvOperandIsOptional(type);
  this = context_local;
  pAVar2 = pAStack_20;
  type_00 = textValue_local._4_4_;
  name = pInst_local;
  local_64 = (uint)bVar3 * 9 + SPV_ERROR_INVALID_TEXT;
  switch(textValue_local._4_4_) {
  case SPV_OPERAND_TYPE_ID:
  case SPV_OPERAND_TYPE_TYPE_ID:
  case SPV_OPERAND_TYPE_RESULT_ID:
  case SPV_OPERAND_TYPE_MEMORY_SEMANTICS_ID:
  case SPV_OPERAND_TYPE_SCOPE_ID:
  case SPV_OPERAND_TYPE_FIRST_OPTIONAL_TYPE:
    if ((char)pInst_local->opcode != OpTypeQueue) {
      spvtools::AssemblyContext::diagnostic(&local_240,pAStack_20);
      pDVar8 = spvtools::DiagnosticStream::operator<<
                         (&local_240,(char (*) [29])"Expected id to start with %.");
      grammar_local._4_4_ = spvtools::DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
      spvtools::DiagnosticStream::~DiagnosticStream(&local_240);
      return grammar_local._4_4_;
    }
    pInst_local = (spv_instruction_t *)((long)&pInst_local->opcode + 1);
    bVar3 = spvIsValidID((char *)pInst_local);
    if (!bVar3) {
      spvtools::AssemblyContext::diagnostic((DiagnosticStream *)&ext_inst_type,pAStack_20);
      pDVar8 = spvtools::DiagnosticStream::operator<<
                         ((DiagnosticStream *)&ext_inst_type,(char (*) [12])"Invalid ID ");
      pDVar8 = spvtools::DiagnosticStream::operator<<(pDVar8,(char **)&pInst_local);
      grammar_local._4_4_ = spvtools::DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
      spvtools::DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&ext_inst_type);
      return grammar_local._4_4_;
    }
    local_41c = spvtools::AssemblyContext::spvNamedIdAssignOrGet(pAStack_20,(char *)pInst_local);
    if (textValue_local._4_4_ == SPV_OPERAND_TYPE_TYPE_ID) {
      *(uint32_t *)
       &(pExpectedOperands_local->
        super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>)._M_impl.
        super__Vector_impl_data._M_finish = local_41c;
    }
    spvInstructionAddWord((spv_instruction_t *)pExpectedOperands_local,local_41c);
    bVar3 = spvIsExtendedInstruction
                      (*(Op *)&(pExpectedOperands_local->
                               super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>
                               )._M_impl.super__Vector_impl_data._M_start);
    if (!bVar3) {
      return SPV_SUCCESS;
    }
    sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       &(pExpectedOperands_local->
                        super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>)
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    pAVar2 = pAStack_20;
    if (sVar5 != 4) {
      return SPV_SUCCESS;
    }
    pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                        &(pExpectedOperands_local->
                         super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>
                         )._M_impl.super__Vector_impl_data._M_end_of_storage,3);
    local_420 = spvtools::AssemblyContext::getExtInstTypeForId(pAVar2,*pvVar7);
    if (local_420 != SPV_EXT_INST_TYPE_NONE) {
      *(spv_ext_inst_type_t *)
       ((long)&(pExpectedOperands_local->
               super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>)._M_impl.
               super__Vector_impl_data._M_start + 4) = local_420;
      return SPV_SUCCESS;
    }
    spvtools::AssemblyContext::diagnostic((DiagnosticStream *)&extInst,pAStack_20);
    pDVar8 = spvtools::DiagnosticStream::operator<<
                       ((DiagnosticStream *)&extInst,
                        (char (*) [40])"Invalid extended instruction import Id ");
    pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                        &(pExpectedOperands_local->
                         super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>
                         )._M_impl.super__Vector_impl_data._M_end_of_storage,2);
    pDVar8 = spvtools::DiagnosticStream::operator<<(pDVar8,pvVar7);
    grammar_local._4_4_ = spvtools::DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
    spvtools::DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&extInst);
    return grammar_local._4_4_;
  case SPV_OPERAND_TYPE_LITERAL_INTEGER:
  case SPV_OPERAND_TYPE_OPTIONAL_LITERAL_INTEGER:
    stack0xfffffffffffff244 = 0x20;
    expected_type.bitwidth = 1;
    grammar_local._4_4_ =
         spvtools::AssemblyContext::binaryEncodeNumericLiteral
                   (pAStack_20,(char *)pInst_local,local_64,(IdType *)&expected_type_1.type_class,
                    (spv_instruction_t *)pExpectedOperands_local);
    OVar1 = grammar_local._4_4_;
    break;
  case SPV_OPERAND_TYPE_EXTENSION_INSTRUCTION_NUMBER:
    sVar4 = spvtools::AssemblyGrammar::lookupExtInst
                      ((AssemblyGrammar *)context_local,
                       *(spv_ext_inst_type_t *)
                        ((long)&(pExpectedOperands_local->
                                super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>
                                )._M_impl.super__Vector_impl_data._M_start + 4),(char *)pInst_local,
                       &local_600);
    if (sVar4 == SPV_SUCCESS) {
      spvInstructionAddWord((spv_instruction_t *)pExpectedOperands_local,local_600->ext_inst);
      spvPushOperandTypes(local_600->operandTypes,psStack_40);
      return SPV_SUCCESS;
    }
    bVar3 = spvExtInstIsNonSemantic
                      (*(spv_ext_inst_type_t *)
                        ((long)&(pExpectedOperands_local->
                                super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>
                                )._M_impl.super__Vector_impl_data._M_start + 4));
    if (!bVar3) {
      spvtools::AssemblyContext::diagnostic
                ((DiagnosticStream *)((long)&extInstValue.str.field_2 + 8),pAStack_20);
      pDVar8 = spvtools::DiagnosticStream::operator<<
                         ((DiagnosticStream *)((long)&extInstValue.str.field_2 + 8),
                          (char (*) [36])"Invalid extended instruction name \'");
      pDVar8 = spvtools::DiagnosticStream::operator<<(pDVar8,(char **)&pInst_local);
      pDVar8 = spvtools::DiagnosticStream::operator<<(pDVar8,(char (*) [3])"\'.");
      grammar_local._4_4_ = spvtools::DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
      spvtools::DiagnosticStream::~DiagnosticStream
                ((DiagnosticStream *)((long)&extInstValue.str.field_2 + 8));
      return grammar_local._4_4_;
    }
    spv_literal_t::spv_literal_t((spv_literal_t *)local_808);
    sVar4 = spvTextToLiteral((char *)pInst_local,(spv_literal_t *)local_808);
    if ((sVar4 == SPV_SUCCESS) && (local_808._0_4_ == SPV_LITERAL_TYPE_UINT_32)) {
      spvInstructionAddWord((spv_instruction_t *)pExpectedOperands_local,extInstValue.type);
      local_9e8 = SPV_OPERAND_TYPE_FIRST_VARIABLE_TYPE;
      std::vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>::push_back
                (psStack_40,&local_9e8);
      opcode = OpNop;
    }
    else {
      spvtools::AssemblyContext::diagnostic(&local_9e0,pAStack_20);
      pDVar8 = spvtools::DiagnosticStream::operator<<
                         (&local_9e0,
                          (char (*) [55])"Couldn\'t translate unknown extended instruction name \'")
      ;
      pDVar8 = spvtools::DiagnosticStream::operator<<(pDVar8,(char **)&pInst_local);
      pDVar8 = spvtools::DiagnosticStream::operator<<
                         (pDVar8,(char (*) [23])"\' to unsigned integer.");
      grammar_local._4_4_ = spvtools::DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
      spvtools::DiagnosticStream::~DiagnosticStream(&local_9e0);
      opcode = OpUndef;
    }
    spv_literal_t::~spv_literal_t((spv_literal_t *)local_808);
    OVar1 = opcode;
    break;
  case SPV_OPERAND_TYPE_SPEC_CONSTANT_OP_NUMBER:
    sVar4 = spvtools::AssemblyGrammar::lookupSpecConstantOpcode
                      ((AssemblyGrammar *)context_local,(char *)pInst_local,&local_9ec);
    if (sVar4 != SPV_SUCCESS) {
      spvtools::AssemblyContext::diagnostic(&local_bc8,pAStack_20);
      pDVar8 = spvtools::DiagnosticStream::operator<<(&local_bc8,(char (*) [9])"Invalid ");
      opcodeEntry = (spv_opcode_desc)spvOperandTypeStr(textValue_local._4_4_);
      pDVar8 = spvtools::DiagnosticStream::operator<<(pDVar8,(char **)&opcodeEntry);
      pDVar8 = spvtools::DiagnosticStream::operator<<(pDVar8,(char (*) [3])0xe2ad31);
      pDVar8 = spvtools::DiagnosticStream::operator<<(pDVar8,(char **)&pInst_local);
      pDVar8 = spvtools::DiagnosticStream::operator<<(pDVar8,(char (*) [3])"\'.");
      grammar_local._4_4_ = spvtools::DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
      spvtools::DiagnosticStream::~DiagnosticStream(&local_bc8);
      return grammar_local._4_4_;
    }
    local_bd8 = (spv_opcode_desc)0x0;
    sVar4 = spvtools::AssemblyGrammar::lookupOpcode
                      ((AssemblyGrammar *)context_local,local_9ec,&local_bd8);
    if (sVar4 != SPV_SUCCESS) {
      spvtools::AssemblyContext::diagnostic
                ((DiagnosticStream *)&expected_type.isSigned,pAStack_20,SPV_ERROR_INTERNAL);
      pDVar8 = spvtools::DiagnosticStream::operator<<
                         ((DiagnosticStream *)&expected_type.isSigned,
                          (char (*) [40])"OpSpecConstant opcode table out of sync");
      grammar_local._4_4_ = spvtools::DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
      spvtools::DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&expected_type.isSigned);
      return grammar_local._4_4_;
    }
    spvInstructionAddWord((spv_instruction_t *)pExpectedOperands_local,local_bd8->opcode);
    if ((local_bd8->hasType & 1U) == 0) {
      __assert_fail("opcodeEntry->hasType",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/text.cpp"
                    ,0x128,
                    "spv_result_t spvTextEncodeOperand(const spvtools::AssemblyGrammar &, spvtools::AssemblyContext *, const spv_operand_type_t, const char *, spv_instruction_t *, spv_operand_pattern_t *)"
                   );
    }
    if ((local_bd8->hasResult & 1U) != 0) {
      if (1 < local_bd8->numTypes) {
        spvPushOperandTypes(local_bd8->operandTypes + 2,psStack_40);
        return SPV_SUCCESS;
      }
      __assert_fail("opcodeEntry->numTypes >= 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/text.cpp"
                    ,0x12a,
                    "spv_result_t spvTextEncodeOperand(const spvtools::AssemblyGrammar &, spvtools::AssemblyContext *, const spv_operand_type_t, const char *, spv_instruction_t *, spv_operand_pattern_t *)"
                   );
    }
    __assert_fail("opcodeEntry->hasResult",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/text.cpp"
                  ,0x129,
                  "spv_result_t spvTextEncodeOperand(const spvtools::AssemblyGrammar &, spvtools::AssemblyContext *, const spv_operand_type_t, const char *, spv_instruction_t *, spv_operand_pattern_t *)"
                 );
  case SPV_OPERAND_TYPE_TYPED_LITERAL_NUMBER:
  case SPV_OPERAND_TYPE_OPTIONAL_TYPED_LITERAL_INTEGER:
    local_de0 = (spv_opcode_desc)0x0;
    expected_type_2.bitwidth = 0;
    if ((*(int *)&(pExpectedOperands_local->
                  super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>).
                  _M_impl.super__Vector_impl_data._M_start == 0x2b) ||
       (*(int *)&(pExpectedOperands_local->
                 super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>).
                 _M_impl.super__Vector_impl_data._M_start == 0x32)) {
      _d = spvtools::AssemblyContext::getTypeOfTypeGeneratingValue
                     (pAStack_20,
                      *(uint32_t *)
                       &(pExpectedOperands_local->
                        super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>)
                        ._M_impl.super__Vector_impl_data._M_finish);
      local_dec = d;
      local_de4 = local_df8;
      local_de0 = d;
      expected_type_2.bitwidth = local_df8;
      bVar3 = spvtools::isScalarFloating((IdType *)&local_de0);
      if ((!bVar3) && (bVar3 = spvtools::isScalarIntegral((IdType *)&local_de0), !bVar3)) {
        local_e10 = "opcode";
        sVar4 = spvtools::AssemblyGrammar::lookupOpcode
                          ((AssemblyGrammar *)context_local,
                           *(Op *)&(pExpectedOperands_local->
                                   super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>
                                   )._M_impl.super__Vector_impl_data._M_start,
                           (spv_opcode_desc *)&opcode_name);
        if (sVar4 == SPV_SUCCESS) {
          local_e10 = *(char **)opcode_name;
        }
        spvtools::AssemblyContext::diagnostic(&local_fe8,pAStack_20);
        pDVar8 = spvtools::DiagnosticStream::operator<<(&local_fe8,(char (*) [10])"Type for ");
        pDVar8 = spvtools::DiagnosticStream::operator<<(pDVar8,&local_e10);
        pDVar8 = spvtools::DiagnosticStream::operator<<
                           (pDVar8,(char (*) [49])" must be a scalar floating point or integer type"
                           );
        grammar_local._4_4_ = spvtools::DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
        spvtools::DiagnosticStream::~DiagnosticStream(&local_fe8);
        return grammar_local._4_4_;
      }
    }
    else if (*(int *)&(pExpectedOperands_local->
                      super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>).
                      _M_impl.super__Vector_impl_data._M_start == 0xfb) {
      pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                          &(pExpectedOperands_local->
                           super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>
                           )._M_impl.super__Vector_impl_data._M_end_of_storage,1);
      local_1008 = spvtools::AssemblyContext::getTypeOfValueInstruction(pAVar2,*pvVar7);
      local_ff4 = (spv_opcode_desc)local_1008._0_8_;
      local_fec = local_1008.type_class;
      local_de0 = (spv_opcode_desc)local_1008._0_8_;
      expected_type_2.bitwidth = local_1008.type_class;
      bVar3 = spvtools::isScalarIntegral((IdType *)&local_de0);
      if (!bVar3) {
        spvtools::AssemblyContext::diagnostic((DiagnosticStream *)local_11e0,pAStack_20);
        pDVar8 = spvtools::DiagnosticStream::operator<<
                           ((DiagnosticStream *)local_11e0,
                            (char (*) [104])
                            "The selector operand for OpSwitch must be the result of an instruction that generates an integer scalar"
                           );
        grammar_local._4_4_ = spvtools::DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
        spvtools::DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_11e0);
        return grammar_local._4_4_;
      }
    }
    grammar_local._4_4_ =
         spvtools::AssemblyContext::binaryEncodeNumericLiteral
                   (pAStack_20,(char *)pInst_local,local_64,(IdType *)&local_de0,
                    (spv_instruction_t *)pExpectedOperands_local);
    OVar1 = grammar_local._4_4_;
    break;
  case SPV_OPERAND_TYPE_LITERAL_FLOAT:
    error_3 = 0x20;
    error_2._0_1_ = false;
    error_2._1_3_ = 0;
    expected_type_1.bitwidth = 2;
    grammar_local._4_4_ =
         spvtools::AssemblyContext::binaryEncodeNumericLiteral
                   (pAStack_20,(char *)pInst_local,local_64,(IdType *)&error_3,
                    (spv_instruction_t *)pExpectedOperands_local);
    OVar1 = grammar_local._4_4_;
    break;
  case SPV_OPERAND_TYPE_LITERAL_STRING:
  case SPV_OPERAND_TYPE_OPTIONAL_LITERAL_STRING:
    local_1218 = (undefined1  [4])0x0;
    literal.type = SPV_LITERAL_TYPE_INT_32;
    std::__cxx11::string::string((string *)&literal.value);
    local_121c = spvTextToLiteral((char *)pInst_local,(spv_literal_t *)local_1218);
    if (local_121c == OpNop) {
      if (local_1218 == (undefined1  [4])0x6) {
        if (*(int *)&(pExpectedOperands_local->
                     super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>).
                     _M_impl.super__Vector_impl_data._M_start == 0xb) {
          pcVar6 = (char *)std::__cxx11::string::c_str();
          local_15d4 = spvExtInstImportTypeGet(pcVar6);
          pAVar2 = pAStack_20;
          if (local_15d4 == SPV_EXT_INST_TYPE_NONE) {
            spvtools::AssemblyContext::diagnostic((DiagnosticStream *)&error_6,pAStack_20);
            pDVar8 = spvtools::DiagnosticStream::operator<<
                               ((DiagnosticStream *)&error_6,
                                (char (*) [38])"Invalid extended instruction import \'");
            pDVar8 = spvtools::DiagnosticStream::operator<<
                               (pDVar8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&literal.value);
            pDVar8 = spvtools::DiagnosticStream::operator<<(pDVar8,(char (*) [2])0xe2ad32);
            grammar_local._4_4_ = spvtools::DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
            spvtools::DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&error_6);
            opcode = OpUndef;
          }
          else {
            pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                               ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                &(pExpectedOperands_local->
                                 super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>
                                 )._M_impl.super__Vector_impl_data._M_end_of_storage,1);
            local_121c = spvtools::AssemblyContext::recordIdAsExtInstImport
                                   (pAVar2,*pvVar7,local_15d4);
            if (local_121c == OpNop) goto LAB_00a8d4ca;
            opcode = OpUndef;
            grammar_local._4_4_ = local_121c;
          }
        }
        else {
LAB_00a8d4ca:
          pAVar2 = pAStack_20;
          pcVar6 = (char *)std::__cxx11::string::c_str();
          sVar4 = spvtools::AssemblyContext::binaryEncodeString
                            (pAVar2,pcVar6,(spv_instruction_t *)pExpectedOperands_local);
          if (sVar4 == SPV_SUCCESS) {
            opcode = OpNop;
          }
          else {
            grammar_local._4_4_ = ~OpSourceExtension;
            opcode = OpUndef;
          }
        }
      }
      else {
        spvtools::AssemblyContext::diagnostic((DiagnosticStream *)local_15d0,pAStack_20);
        pDVar8 = spvtools::DiagnosticStream::operator<<
                           ((DiagnosticStream *)local_15d0,
                            (char (*) [48])"Expected literal string, found literal number \'");
        pDVar8 = spvtools::DiagnosticStream::operator<<(pDVar8,(char **)&pInst_local);
        pDVar8 = spvtools::DiagnosticStream::operator<<(pDVar8,(char (*) [3])"\'.");
        grammar_local._4_4_ = spvtools::DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
        spvtools::DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_15d0);
        opcode = OpUndef;
      }
    }
    else if (local_121c == ~OpUndef) {
      opcode = OpUndef;
      grammar_local._4_4_ = ~OpUndef;
    }
    else {
      spvtools::AssemblyContext::diagnostic(&local_13f8,pAStack_20,local_64);
      pDVar8 = spvtools::DiagnosticStream::operator<<
                         (&local_13f8,(char (*) [25])"Invalid literal string \'");
      pDVar8 = spvtools::DiagnosticStream::operator<<(pDVar8,(char **)&pInst_local);
      pDVar8 = spvtools::DiagnosticStream::operator<<(pDVar8,(char (*) [3])"\'.");
      grammar_local._4_4_ = spvtools::DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
      spvtools::DiagnosticStream::~DiagnosticStream(&local_13f8);
      opcode = OpUndef;
    }
    spv_literal_t::~spv_literal_t((spv_literal_t *)local_1218);
    OVar1 = opcode;
    break;
  default:
    name_len = strlen((char *)pInst_local);
    sVar4 = spvtools::AssemblyGrammar::lookupOperand
                      ((AssemblyGrammar *)this,type_00,(char *)name,name_len,&local_1b88);
    if (sVar4 != SPV_SUCCESS) {
      spvtools::AssemblyContext::diagnostic(&local_1d60,pAStack_20);
      pDVar8 = spvtools::DiagnosticStream::operator<<(&local_1d60,(char (*) [9])"Invalid ");
      local_1d68 = spvOperandTypeStr(textValue_local._4_4_);
      pDVar8 = spvtools::DiagnosticStream::operator<<(pDVar8,&local_1d68);
      pDVar8 = spvtools::DiagnosticStream::operator<<(pDVar8,(char (*) [3])0xe2ad31);
      pDVar8 = spvtools::DiagnosticStream::operator<<(pDVar8,(char **)&pInst_local);
      pDVar8 = spvtools::DiagnosticStream::operator<<(pDVar8,(char (*) [3])"\'.");
      grammar_local._4_4_ = spvtools::DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
      spvtools::DiagnosticStream::~DiagnosticStream(&local_1d60);
      return grammar_local._4_4_;
    }
    sVar4 = spvtools::AssemblyContext::binaryEncodeU32
                      (pAStack_20,local_1b88->value,(spv_instruction_t *)pExpectedOperands_local);
    if (sVar4 == SPV_SUCCESS) {
      spvPushOperandTypes(local_1b88->operandTypes,psStack_40);
      return SPV_SUCCESS;
    }
    spvtools::AssemblyContext::diagnostic(&local_1f40,pAStack_20);
    pDVar8 = spvtools::DiagnosticStream::operator<<(&local_1f40,(char (*) [9])"Invalid ");
    local_1f48 = spvOperandTypeStr(textValue_local._4_4_);
    pDVar8 = spvtools::DiagnosticStream::operator<<(pDVar8,&local_1f48);
    pDVar8 = spvtools::DiagnosticStream::operator<<(pDVar8,(char (*) [3])0xe2ad31);
    pDVar8 = spvtools::DiagnosticStream::operator<<(pDVar8,(char **)&pInst_local);
    pDVar8 = spvtools::DiagnosticStream::operator<<(pDVar8,(char (*) [3])"\'.");
    grammar_local._4_4_ = spvtools::DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
    spvtools::DiagnosticStream::~DiagnosticStream(&local_1f40);
    return grammar_local._4_4_;
  case SPV_OPERAND_TYPE_IMAGE:
  case SPV_OPERAND_TYPE_FP_FAST_MATH_MODE:
  case SPV_OPERAND_TYPE_SELECTION_CONTROL:
  case SPV_OPERAND_TYPE_LOOP_CONTROL:
  case SPV_OPERAND_TYPE_FUNCTION_CONTROL:
  case SPV_OPERAND_TYPE_OPTIONAL_IMAGE:
  case SPV_OPERAND_TYPE_OPTIONAL_MEMORY_ACCESS:
  case SPV_OPERAND_TYPE_DEBUG_INFO_FLAGS:
  case SPV_OPERAND_TYPE_CLDEBUG100_DEBUG_INFO_FLAGS:
  case SPV_OPERAND_TYPE_OPTIONAL_COOPERATIVE_MATRIX_OPERANDS:
  case SPV_OPERAND_TYPE_OPTIONAL_RAW_ACCESS_CHAIN_OPERANDS:
  case SPV_OPERAND_TYPE_COOPERATIVE_MATRIX_REDUCE:
  case SPV_OPERAND_TYPE_TENSOR_ADDRESSING_OPERANDS:
  case SPV_OPERAND_TYPE_OPTIONAL_MATRIX_MULTIPLY_ACCUMULATE_OPERANDS:
    local_17b8 = spvtools::AssemblyGrammar::parseMaskOperand
                           ((AssemblyGrammar *)context_local,textValue_local._4_4_,
                            (char *)pInst_local,&local_17b4);
    if (local_17b8 != SPV_SUCCESS) {
      spvtools::AssemblyContext::diagnostic(&local_1990,pAStack_20,local_17b8);
      pDVar8 = spvtools::DiagnosticStream::operator<<(&local_1990,(char (*) [9])"Invalid ");
      _error_8 = spvOperandTypeStr(textValue_local._4_4_);
      pDVar8 = spvtools::DiagnosticStream::operator<<(pDVar8,(char **)&error_8);
      pDVar8 = spvtools::DiagnosticStream::operator<<(pDVar8,(char (*) [11])" operand \'");
      pDVar8 = spvtools::DiagnosticStream::operator<<(pDVar8,(char **)&pInst_local);
      pDVar8 = spvtools::DiagnosticStream::operator<<(pDVar8,(char (*) [3])"\'.");
      grammar_local._4_4_ = spvtools::DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
      spvtools::DiagnosticStream::~DiagnosticStream(&local_1990);
      return grammar_local._4_4_;
    }
    local_199c = spvtools::AssemblyContext::binaryEncodeU32
                           (pAStack_20,local_17b4,(spv_instruction_t *)pExpectedOperands_local);
    if (local_199c == SPV_SUCCESS) {
      spvtools::AssemblyGrammar::pushOperandTypesForMask
                ((AssemblyGrammar *)context_local,textValue_local._4_4_,local_17b4,psStack_40);
      return SPV_SUCCESS;
    }
    return local_199c;
  case SPV_OPERAND_TYPE_OPTIONAL_LITERAL_NUMBER:
    grammar_local._4_4_ =
         spvtools::AssemblyContext::binaryEncodeNumericLiteral
                   (pAStack_20,(char *)pInst_local,local_64,(IdType *)&spvtools::kUnknownType,
                    (spv_instruction_t *)pExpectedOperands_local);
    OVar1 = grammar_local._4_4_;
    break;
  case SPV_OPERAND_TYPE_OPTIONAL_CIV:
    local_19a0 = spvTextEncodeOperand
                           ((AssemblyGrammar *)context_local,pAStack_20,
                            SPV_OPERAND_TYPE_OPTIONAL_LITERAL_NUMBER,(char *)pInst_local,
                            (spv_instruction_t *)pExpectedOperands_local,psStack_40);
    if (local_19a0 == SPV_FAILED_MATCH) {
      local_19a0 = spvTextEncodeOperand
                             ((AssemblyGrammar *)context_local,pAStack_20,
                              SPV_OPERAND_TYPE_OPTIONAL_LITERAL_STRING,(char *)pInst_local,
                              (spv_instruction_t *)pExpectedOperands_local,psStack_40);
    }
    if (local_19a0 == SPV_FAILED_MATCH) {
      local_19a0 = spvTextEncodeOperand
                             ((AssemblyGrammar *)context_local,pAStack_20,
                              SPV_OPERAND_TYPE_FIRST_OPTIONAL_TYPE,(char *)pInst_local,
                              (spv_instruction_t *)pExpectedOperands_local,psStack_40);
    }
    if (local_19a0 == SPV_SUCCESS) {
      bVar3 = std::vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>::empty
                        (psStack_40);
      if (!bVar3) {
        return SPV_SUCCESS;
      }
      entry._4_4_ = 0x32;
      std::vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>::push_back
                (psStack_40,(value_type *)((long)&entry + 4));
      return SPV_SUCCESS;
    }
    spvtools::AssemblyContext::diagnostic(&local_1b78,pAStack_20,local_19a0);
    pDVar8 = spvtools::DiagnosticStream::operator<<
                       (&local_1b78,(char (*) [36])"Invalid word following !<integer>: ");
    pDVar8 = spvtools::DiagnosticStream::operator<<(pDVar8,(char **)&pInst_local);
    grammar_local._4_4_ = spvtools::DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
    spvtools::DiagnosticStream::~DiagnosticStream(&local_1b78);
    return grammar_local._4_4_;
  }
  if (OVar1 == OpNop) {
    return SPV_SUCCESS;
  }
  return grammar_local._4_4_;
}

Assistant:

spv_result_t spvTextEncodeOperand(const spvtools::AssemblyGrammar& grammar,
                                  spvtools::AssemblyContext* context,
                                  const spv_operand_type_t type,
                                  const char* textValue,
                                  spv_instruction_t* pInst,
                                  spv_operand_pattern_t* pExpectedOperands) {
  // NOTE: Handle immediate int in the stream
  if ('!' == textValue[0]) {
    if (auto error = encodeImmediate(context, textValue, pInst)) {
      return error;
    }
    *pExpectedOperands =
        spvAlternatePatternFollowingImmediate(*pExpectedOperands);
    return SPV_SUCCESS;
  }

  // Optional literal operands can fail to parse. In that case use
  // SPV_FAILED_MATCH to avoid emitting a diagnostic.  Use the following
  // for those situations.
  spv_result_t error_code_for_literals =
      spvOperandIsOptional(type) ? SPV_FAILED_MATCH : SPV_ERROR_INVALID_TEXT;

  switch (type) {
    case SPV_OPERAND_TYPE_ID:
    case SPV_OPERAND_TYPE_TYPE_ID:
    case SPV_OPERAND_TYPE_RESULT_ID:
    case SPV_OPERAND_TYPE_MEMORY_SEMANTICS_ID:
    case SPV_OPERAND_TYPE_SCOPE_ID:
    case SPV_OPERAND_TYPE_OPTIONAL_ID: {
      if ('%' == textValue[0]) {
        textValue++;
      } else {
        return context->diagnostic() << "Expected id to start with %.";
      }
      if (!spvIsValidID(textValue)) {
        return context->diagnostic() << "Invalid ID " << textValue;
      }
      const uint32_t id = context->spvNamedIdAssignOrGet(textValue);
      if (type == SPV_OPERAND_TYPE_TYPE_ID) pInst->resultTypeId = id;
      spvInstructionAddWord(pInst, id);

      // Set the extended instruction type.
      // The import set id is the 3rd operand of OpExtInst.
      if (spvIsExtendedInstruction(pInst->opcode) && pInst->words.size() == 4) {
        auto ext_inst_type = context->getExtInstTypeForId(pInst->words[3]);
        if (ext_inst_type == SPV_EXT_INST_TYPE_NONE) {
          return context->diagnostic()
                 << "Invalid extended instruction import Id "
                 << pInst->words[2];
        }
        pInst->extInstType = ext_inst_type;
      }
    } break;

    case SPV_OPERAND_TYPE_EXTENSION_INSTRUCTION_NUMBER: {
      // The assembler accepts the symbolic name for an extended instruction,
      // and emits its corresponding number.
      spv_ext_inst_desc extInst;
      if (grammar.lookupExtInst(pInst->extInstType, textValue, &extInst) ==
          SPV_SUCCESS) {
        // if we know about this extended instruction, push the numeric value
        spvInstructionAddWord(pInst, extInst->ext_inst);

        // Prepare to parse the operands for the extended instructions.
        spvPushOperandTypes(extInst->operandTypes, pExpectedOperands);
      } else {
        // if we don't know this extended instruction and the set isn't
        // non-semantic, we cannot process further
        if (!spvExtInstIsNonSemantic(pInst->extInstType)) {
          return context->diagnostic()
                 << "Invalid extended instruction name '" << textValue << "'.";
        } else {
          // for non-semantic instruction sets, as long as the text name is an
          // integer value we can encode it since we know the form of all such
          // extended instructions
          spv_literal_t extInstValue;
          if (spvTextToLiteral(textValue, &extInstValue) ||
              extInstValue.type != SPV_LITERAL_TYPE_UINT_32) {
            return context->diagnostic()
                   << "Couldn't translate unknown extended instruction name '"
                   << textValue << "' to unsigned integer.";
          }

          spvInstructionAddWord(pInst, extInstValue.value.u32);

          // opcode contains an unknown number of IDs.
          pExpectedOperands->push_back(SPV_OPERAND_TYPE_VARIABLE_ID);
        }
      }
    } break;

    case SPV_OPERAND_TYPE_SPEC_CONSTANT_OP_NUMBER: {
      // The assembler accepts the symbolic name for the opcode, but without
      // the "Op" prefix.  For example, "IAdd" is accepted.  The number
      // of the opcode is emitted.
      spv::Op opcode;
      if (grammar.lookupSpecConstantOpcode(textValue, &opcode)) {
        return context->diagnostic() << "Invalid " << spvOperandTypeStr(type)
                                     << " '" << textValue << "'.";
      }
      spv_opcode_desc opcodeEntry = nullptr;
      if (grammar.lookupOpcode(opcode, &opcodeEntry)) {
        return context->diagnostic(SPV_ERROR_INTERNAL)
               << "OpSpecConstant opcode table out of sync";
      }
      spvInstructionAddWord(pInst, uint32_t(opcodeEntry->opcode));

      // Prepare to parse the operands for the opcode.  Except skip the
      // type Id and result Id, since they've already been processed.
      assert(opcodeEntry->hasType);
      assert(opcodeEntry->hasResult);
      assert(opcodeEntry->numTypes >= 2);
      spvPushOperandTypes(opcodeEntry->operandTypes + 2, pExpectedOperands);
    } break;

    case SPV_OPERAND_TYPE_LITERAL_INTEGER:
    case SPV_OPERAND_TYPE_OPTIONAL_LITERAL_INTEGER: {
      // The current operand is an *unsigned* 32-bit integer.
      // That's just how the grammar works.
      spvtools::IdType expected_type = {
          32, false, spvtools::IdTypeClass::kScalarIntegerType};
      if (auto error = context->binaryEncodeNumericLiteral(
              textValue, error_code_for_literals, expected_type, pInst)) {
        return error;
      }
    } break;

    case SPV_OPERAND_TYPE_LITERAL_FLOAT: {
      // The current operand is a 32-bit float.
      // That's just how the grammar works.
      spvtools::IdType expected_type = {
          32, false, spvtools::IdTypeClass::kScalarFloatType};
      if (auto error = context->binaryEncodeNumericLiteral(
              textValue, error_code_for_literals, expected_type, pInst)) {
        return error;
      }
    } break;

    case SPV_OPERAND_TYPE_OPTIONAL_LITERAL_NUMBER:
      // This is a context-independent literal number which can be a 32-bit
      // number of floating point value.
      if (auto error = context->binaryEncodeNumericLiteral(
              textValue, error_code_for_literals, spvtools::kUnknownType,
              pInst)) {
        return error;
      }
      break;

    case SPV_OPERAND_TYPE_OPTIONAL_TYPED_LITERAL_INTEGER:
    case SPV_OPERAND_TYPE_TYPED_LITERAL_NUMBER: {
      spvtools::IdType expected_type = spvtools::kUnknownType;
      // The encoding for OpConstant, OpSpecConstant and OpSwitch all
      // depend on either their own result-id or the result-id of
      // one of their parameters.
      if (spv::Op::OpConstant == pInst->opcode ||
          spv::Op::OpSpecConstant == pInst->opcode) {
        // The type of the literal is determined by the type Id of the
        // instruction.
        expected_type =
            context->getTypeOfTypeGeneratingValue(pInst->resultTypeId);
        if (!spvtools::isScalarFloating(expected_type) &&
            !spvtools::isScalarIntegral(expected_type)) {
          spv_opcode_desc d;
          const char* opcode_name = "opcode";
          if (SPV_SUCCESS == grammar.lookupOpcode(pInst->opcode, &d)) {
            opcode_name = d->name;
          }
          return context->diagnostic()
                 << "Type for " << opcode_name
                 << " must be a scalar floating point or integer type";
        }
      } else if (pInst->opcode == spv::Op::OpSwitch) {
        // The type of the literal is the same as the type of the selector.
        expected_type = context->getTypeOfValueInstruction(pInst->words[1]);
        if (!spvtools::isScalarIntegral(expected_type)) {
          return context->diagnostic()
                 << "The selector operand for OpSwitch must be the result"
                    " of an instruction that generates an integer scalar";
        }
      }
      if (auto error = context->binaryEncodeNumericLiteral(
              textValue, error_code_for_literals, expected_type, pInst)) {
        return error;
      }
    } break;

    case SPV_OPERAND_TYPE_LITERAL_STRING:
    case SPV_OPERAND_TYPE_OPTIONAL_LITERAL_STRING: {
      spv_literal_t literal = {};
      spv_result_t error = spvTextToLiteral(textValue, &literal);
      if (error != SPV_SUCCESS) {
        if (error == SPV_ERROR_OUT_OF_MEMORY) return error;
        return context->diagnostic(error_code_for_literals)
               << "Invalid literal string '" << textValue << "'.";
      }
      if (literal.type != SPV_LITERAL_TYPE_STRING) {
        return context->diagnostic()
               << "Expected literal string, found literal number '" << textValue
               << "'.";
      }

      // NOTE: Special case for extended instruction library import
      if (spv::Op::OpExtInstImport == pInst->opcode) {
        const spv_ext_inst_type_t ext_inst_type =
            spvExtInstImportTypeGet(literal.str.c_str());
        if (SPV_EXT_INST_TYPE_NONE == ext_inst_type) {
          return context->diagnostic()
                 << "Invalid extended instruction import '" << literal.str
                 << "'";
        }
        if ((error = context->recordIdAsExtInstImport(pInst->words[1],
                                                      ext_inst_type)))
          return error;
      }

      if (context->binaryEncodeString(literal.str.c_str(), pInst))
        return SPV_ERROR_INVALID_TEXT;
    } break;

    // Masks.
    case SPV_OPERAND_TYPE_FP_FAST_MATH_MODE:
    case SPV_OPERAND_TYPE_FUNCTION_CONTROL:
    case SPV_OPERAND_TYPE_LOOP_CONTROL:
    case SPV_OPERAND_TYPE_IMAGE:
    case SPV_OPERAND_TYPE_OPTIONAL_IMAGE:
    case SPV_OPERAND_TYPE_OPTIONAL_MEMORY_ACCESS:
    case SPV_OPERAND_TYPE_OPTIONAL_RAW_ACCESS_CHAIN_OPERANDS:
    case SPV_OPERAND_TYPE_SELECTION_CONTROL:
    case SPV_OPERAND_TYPE_DEBUG_INFO_FLAGS:
    case SPV_OPERAND_TYPE_CLDEBUG100_DEBUG_INFO_FLAGS:
    case SPV_OPERAND_TYPE_OPTIONAL_COOPERATIVE_MATRIX_OPERANDS:
    case SPV_OPERAND_TYPE_TENSOR_ADDRESSING_OPERANDS:
    case SPV_OPERAND_TYPE_COOPERATIVE_MATRIX_REDUCE:
    case SPV_OPERAND_TYPE_OPTIONAL_MATRIX_MULTIPLY_ACCUMULATE_OPERANDS: {
      uint32_t value;
      if (auto error = grammar.parseMaskOperand(type, textValue, &value)) {
        return context->diagnostic(error)
               << "Invalid " << spvOperandTypeStr(type) << " operand '"
               << textValue << "'.";
      }
      if (auto error = context->binaryEncodeU32(value, pInst)) return error;
      // Prepare to parse the operands for this logical operand.
      grammar.pushOperandTypesForMask(type, value, pExpectedOperands);
    } break;
    case SPV_OPERAND_TYPE_OPTIONAL_CIV: {
      auto error = spvTextEncodeOperand(
          grammar, context, SPV_OPERAND_TYPE_OPTIONAL_LITERAL_NUMBER, textValue,
          pInst, pExpectedOperands);
      if (error == SPV_FAILED_MATCH) {
        // It's not a literal number -- is it a literal string?
        error = spvTextEncodeOperand(grammar, context,
                                     SPV_OPERAND_TYPE_OPTIONAL_LITERAL_STRING,
                                     textValue, pInst, pExpectedOperands);
      }
      if (error == SPV_FAILED_MATCH) {
        // It's not a literal -- is it an ID?
        error =
            spvTextEncodeOperand(grammar, context, SPV_OPERAND_TYPE_OPTIONAL_ID,
                                 textValue, pInst, pExpectedOperands);
      }
      if (error) {
        return context->diagnostic(error)
               << "Invalid word following !<integer>: " << textValue;
      }
      if (pExpectedOperands->empty()) {
        pExpectedOperands->push_back(SPV_OPERAND_TYPE_OPTIONAL_CIV);
      }
    } break;
    default: {
      // NOTE: All non literal operands are handled here using the operand
      // table.
      spv_operand_desc entry;
      if (grammar.lookupOperand(type, textValue, strlen(textValue), &entry)) {
        return context->diagnostic() << "Invalid " << spvOperandTypeStr(type)
                                     << " '" << textValue << "'.";
      }
      if (context->binaryEncodeU32(entry->value, pInst)) {
        return context->diagnostic() << "Invalid " << spvOperandTypeStr(type)
                                     << " '" << textValue << "'.";
      }

      // Prepare to parse the operands for this logical operand.
      spvPushOperandTypes(entry->operandTypes, pExpectedOperands);
    } break;
  }
  return SPV_SUCCESS;
}